

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall
Json::BuiltStyledStreamWriter::isMultilineArray(BuiltStyledStreamWriter *this,Value *value)

{
  byte bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  AVar3 = Value::size(value);
  bVar9 = this->rightMargin_ <= AVar3 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (AVar3 != 0 && !bVar9) {
    uVar6 = 1;
    do {
      pVVar4 = Value::operator[](value,uVar6 - 1);
      bVar9 = Value::isArray(pVVar4);
      if (bVar9) {
LAB_005658f7:
        bVar9 = Value::empty(pVVar4);
        bVar9 = !bVar9;
      }
      else {
        bVar9 = Value::isObject(pVVar4);
        if (bVar9) goto LAB_005658f7;
        bVar9 = false;
      }
    } while ((uVar6 < AVar3) && (uVar6 = uVar6 + 1, !bVar9));
  }
  bVar2 = true;
  if (!bVar9) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar3);
    bVar1 = this->field_0xd8 | 1;
    this->field_0xd8 = bVar1;
    uVar6 = AVar3 * 2 + 2;
    if (AVar3 == 0) {
      bVar5 = 0;
    }
    else {
      lVar7 = 8;
      uVar8 = 0;
      bVar5 = 0;
      do {
        pVVar4 = Value::operator[](value,(ArrayIndex)uVar8);
        bVar9 = hasCommentForValue(pVVar4);
        bVar5 = bVar5 | bVar9;
        pVVar4 = Value::operator[](value,(ArrayIndex)uVar8);
        writeValue(this,pVVar4);
        uVar6 = uVar6 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (AVar3 != uVar8);
      bVar1 = this->field_0xd8;
    }
    this->field_0xd8 = bVar1 & 0xfe;
    bVar2 = (bool)(this->rightMargin_ <= uVar6 | bVar5);
  }
  return bVar2;
}

Assistant:

bool BuiltStyledStreamWriter::isMultilineArray(Value const& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    Value const& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}